

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dgConvexHull3d.cpp
# Opt level: O2

dgAABBPointTree3d * __thiscall
dgConvexHull3d::BuildTree
          (dgConvexHull3d *this,dgAABBPointTree3d *parent,dgHullVertex *points,HaI32 count,
          HaI32 baseIndex,HaI8 **memoryPool,HaI32 *maxMemSize)

{
  dgTemplateVector<double> *this_00;
  dgHullVertex *pdVar1;
  double dVar2;
  undefined1 auVar3 [16];
  undefined1 auVar4 [16];
  undefined1 auVar5 [16];
  double dVar6;
  double dVar7;
  double dVar8;
  double dVar9;
  undefined1 auVar10 [8];
  double *pdVar11;
  dgAABBPointTree3d *pdVar12;
  ulong uVar13;
  HaI32 i_00;
  dgAABBPointTree3d *parent_00;
  HaI32 i;
  int iVar14;
  dgHullVertex *pdVar15;
  long lVar16;
  uint count_00;
  ulong uVar17;
  ulong uVar18;
  ulong uVar19;
  long lVar20;
  double dVar21;
  undefined1 auVar22 [16];
  undefined1 auVar23 [16];
  undefined1 auVar24 [16];
  undefined1 auVar25 [16];
  undefined1 auVar26 [16];
  undefined1 auVar27 [16];
  undefined1 auVar28 [16];
  dgBigVector center;
  double local_140;
  double local_130;
  undefined1 local_128 [32];
  double local_108;
  double local_e8;
  undefined1 local_d8 [16];
  undefined1 local_c8 [16];
  double dStack_b8;
  double dStack_b0;
  undefined8 local_a8;
  undefined1 local_98 [16];
  dgAABBPointTree3d *local_80;
  undefined1 local_78 [8];
  double dStack_70;
  double dStack_68;
  double dStack_60;
  dgTemplateVector<double> local_50;
  
  if (count == 0) {
    __assert_fail("count",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/cecilysunday[P]chrono/src/chrono_thirdparty/HACDv2/dgConvexHull3d.cpp"
                  ,0xaf,
                  "dgAABBPointTree3d *dgConvexHull3d::BuildTree(dgAABBPointTree3d *const, dgHullVertex *const, hacd::HaI32, hacd::HaI32, hacd::HaI8 **, hacd::HaI32 &) const"
                 );
  }
  if (count < 9) {
    parent_00 = (dgAABBPointTree3d *)*memoryPool;
    *memoryPool = (HaI8 *)&parent_00[1].m_box[1].super_dgTemplateVector<double>.m_y;
    *maxMemSize = *maxMemSize + -0x80;
    if (*maxMemSize < 0) {
      __assert_fail("maxMemSize >= 0",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/cecilysunday[P]chrono/src/chrono_thirdparty/HACDv2/dgConvexHull3d.cpp"
                    ,0xb7,
                    "dgAABBPointTree3d *dgConvexHull3d::BuildTree(dgAABBPointTree3d *const, dgHullVertex *const, hacd::HaI32, hacd::HaI32, hacd::HaI8 **, hacd::HaI32 &) const"
                   );
    }
    local_d8._8_8_ = 0xc30c6bf520000000;
    local_d8._0_8_ = 0xc30c6bf520000000;
    auVar27._8_8_ = 0x430c6bf520000000;
    auVar27._0_8_ = 0x430c6bf520000000;
    auVar24 = ZEXT816(0x430c6bf520000000);
    auVar22 = ZEXT816(0xc30c6bf520000000);
    pdVar11 = &(points->super_dgBigVector).super_dgTemplateVector<double>.m_z;
    *(HaI32 *)&parent_00[1].m_box[0].super_dgTemplateVector<double>.m_x = count;
    uVar13 = 0;
    while (local_108 = auVar24._0_8_, (uint)(~(count >> 0x1f) & count) != uVar13) {
      *(HaI32 *)((long)&parent_00[1].m_box[0].super_dgTemplateVector<double>.m_x + uVar13 * 4 + 4) =
           baseIndex + (int)uVar13;
      uVar13 = uVar13 + 1;
      auVar3._0_8_ = ((dgTemplateVector<double> *)(pdVar11 + -2))->m_x;
      auVar3._8_8_ = ((dgTemplateVector<double> *)(pdVar11 + -2))->m_y;
      auVar23._8_8_ = 0;
      auVar23._0_8_ = *pdVar11;
      pdVar11 = pdVar11 + 5;
      auVar27 = vminpd_avx(auVar27,auVar3);
      auVar24 = vminsd_avx(auVar24,auVar23);
      local_d8 = vmaxpd_avx(local_d8,auVar3);
      auVar22 = vmaxsd_avx(auVar22,auVar23);
    }
    local_130 = auVar22._0_8_;
    parent_00->m_left = (dgAABBPointTree3d *)0x0;
    parent_00->m_right = (dgAABBPointTree3d *)0x0;
  }
  else {
    lVar16 = 0;
    local_78 = (undefined1  [8])0x0;
    dStack_70 = 0.0;
    dStack_68 = 0.0;
    dStack_60 = 0.0;
    local_128._0_16_ = ZEXT416(0) << 0x40;
    local_d8._8_8_ = 0xc30c6bf520000000;
    local_d8._0_8_ = 0xc30c6bf520000000;
    local_98._8_8_ = 0x430c6bf520000000;
    local_98._0_8_ = 0x430c6bf520000000;
    local_108 = 999999986991104.0;
    local_130 = -999999986991104.0;
    local_140 = 0.0;
    local_80 = parent;
    while( true ) {
      dVar6 = dStack_68;
      dVar21 = dStack_70;
      auVar10 = local_78;
      if ((ulong)(uint)count * 0x28 - lVar16 == 0) break;
      dVar2 = *(double *)
               ((long)&(points->super_dgBigVector).super_dgTemplateVector<double>.m_z + lVar16);
      auVar28._8_8_ = 0;
      auVar28._0_8_ = dVar2;
      auVar24._8_8_ = 0;
      auVar24._0_8_ = local_108;
      auVar22 = *(undefined1 (*) [16])
                 ((long)&(points->super_dgBigVector).super_dgTemplateVector<double>.m_x + lVar16);
      this_00 = (dgTemplateVector<double> *)
                ((long)&(points->super_dgBigVector).super_dgTemplateVector<double>.m_x + lVar16);
      auVar24 = vminsd_avx(auVar24,auVar28);
      local_98 = vminpd_avx(local_98,auVar22);
      local_108 = auVar24._0_8_;
      local_d8 = vmaxpd_avx(local_d8,auVar22);
      auVar25._8_8_ = 0;
      auVar25._0_8_ = local_130;
      auVar24 = vmaxsd_avx(auVar25,auVar28);
      local_130 = auVar24._0_8_;
      local_128._8_8_ = (double)local_128._8_8_ + auVar22._8_8_;
      local_128._0_8_ = (double)local_128._0_8_ + auVar22._0_8_;
      local_140 = local_140 + dVar2;
      dgTemplateVector<double>::CompProduct(this_00,this_00);
      lVar16 = lVar16 + 0x28;
      local_78 = (undefined1  [8])((double)auVar10 + (double)local_c8._0_8_);
      dStack_70 = dVar21 + (double)local_c8._8_8_;
      dStack_68 = dVar6 + dStack_b8;
    }
    dVar21 = (double)count;
    auVar22._0_8_ = (double)local_78 * dVar21;
    auVar22._8_8_ = dStack_70 * dVar21;
    dStack_b8 = dStack_68 * dVar21 - local_140 * local_140;
    auVar26._0_8_ = (double)local_128._0_8_ * (double)local_128._0_8_;
    auVar26._8_8_ = (double)local_128._8_8_ * (double)local_128._8_8_;
    local_c8 = vsubpd_avx(auVar22,auVar26);
    dStack_b0 = 0.0;
    dgBigVector::dgBigVector((dgBigVector *)local_78,(dgTemplateVector<double> *)local_c8);
    i_00 = 0;
    local_e8 = -10000000000.0;
    for (iVar14 = 0; iVar14 != 3; iVar14 = iVar14 + 1) {
      pdVar11 = dgTemplateVector<double>::operator[]((dgTemplateVector<double> *)local_78,iVar14);
      if (local_e8 < *pdVar11) {
        pdVar11 = dgTemplateVector<double>::operator[]((dgTemplateVector<double> *)local_78,iVar14);
        local_e8 = *pdVar11;
        i_00 = iVar14;
      }
    }
    dVar21 = 1.0 / (double)count;
    dStack_b8 = dVar21 * local_140;
    local_c8._8_8_ = dVar21 * (double)local_128._8_8_;
    local_c8._0_8_ = dVar21 * (double)local_128._0_8_;
    dStack_b0 = 0.0;
    dgBigVector::dgBigVector((dgBigVector *)&local_50,(dgTemplateVector<double> *)local_c8);
    pdVar11 = dgTemplateVector<double>::operator[](&local_50,i_00);
    dVar21 = *pdVar11;
    uVar13 = 0;
    uVar18 = (ulong)(count - 1U);
    do {
      uVar18 = (ulong)(int)uVar18;
      uVar19 = (ulong)(int)uVar13;
      uVar17 = uVar18 + 1;
      if ((long)(uVar18 + 1) <= (long)uVar19) {
        uVar17 = uVar19;
      }
      pdVar15 = points + uVar19;
      while ((uVar13 = uVar17, uVar17 != uVar19 &&
             (pdVar11 = dgTemplateVector<double>::operator[]
                                  ((dgTemplateVector<double> *)pdVar15,i_00), uVar13 = uVar19,
             *pdVar11 <= dVar21))) {
        uVar19 = uVar19 + 1;
        pdVar15 = pdVar15 + 1;
      }
      pdVar15 = points + uVar18;
      iVar14 = (int)uVar13;
      lVar16 = (long)iVar14;
      lVar20 = uVar18 << 0x20;
      while ((lVar16 <= (long)uVar18 &&
             (pdVar11 = dgTemplateVector<double>::operator[]
                                  ((dgTemplateVector<double> *)pdVar15,i_00), dVar21 <= *pdVar11)))
      {
        uVar18 = uVar18 - 1;
        pdVar15 = pdVar15 + -1;
        lVar20 = lVar20 + -0x100000000;
      }
      if (iVar14 < (int)uVar18) {
        lVar20 = lVar20 >> 0x20;
        uVar13 = (ulong)(iVar14 + 1);
        uVar18 = (ulong)((int)uVar18 - 1);
        local_a8 = *(undefined8 *)&points[lVar16].m_index;
        pdVar15 = points + lVar16;
        dVar6 = (pdVar15->super_dgBigVector).super_dgTemplateVector<double>.m_x;
        dVar2 = (pdVar15->super_dgBigVector).super_dgTemplateVector<double>.m_y;
        local_c8._0_8_ = (pdVar15->super_dgBigVector).super_dgTemplateVector<double>.m_x;
        local_c8._8_8_ = (pdVar15->super_dgBigVector).super_dgTemplateVector<double>.m_y;
        dStack_b8 = (pdVar15->super_dgBigVector).super_dgTemplateVector<double>.m_z;
        dStack_b0 = (pdVar15->super_dgBigVector).super_dgTemplateVector<double>.m_w;
        points[lVar16].m_index = points[lVar20].m_index;
        pdVar15 = points + lVar20;
        dVar7 = (pdVar15->super_dgBigVector).super_dgTemplateVector<double>.m_y;
        dVar8 = (pdVar15->super_dgBigVector).super_dgTemplateVector<double>.m_z;
        dVar9 = (pdVar15->super_dgBigVector).super_dgTemplateVector<double>.m_w;
        pdVar1 = points + lVar16;
        (pdVar1->super_dgBigVector).super_dgTemplateVector<double>.m_x =
             (pdVar15->super_dgBigVector).super_dgTemplateVector<double>.m_x;
        (pdVar1->super_dgBigVector).super_dgTemplateVector<double>.m_y = dVar7;
        (pdVar1->super_dgBigVector).super_dgTemplateVector<double>.m_z = dVar8;
        (pdVar1->super_dgBigVector).super_dgTemplateVector<double>.m_w = dVar9;
        points[lVar20].m_index = (HaI32)local_a8;
        pdVar15 = points + lVar20;
        (pdVar15->super_dgBigVector).super_dgTemplateVector<double>.m_x = dVar6;
        (pdVar15->super_dgBigVector).super_dgTemplateVector<double>.m_y = dVar2;
        (pdVar15->super_dgBigVector).super_dgTemplateVector<double>.m_z = dStack_b8;
        (pdVar15->super_dgBigVector).super_dgTemplateVector<double>.m_w = dStack_b0;
      }
      count_00 = (uint)uVar13;
    } while ((int)count_00 <= (int)uVar18);
    if (count_00 == 0) {
      count_00 = (uint)count >> 1;
    }
    parent_00 = (dgAABBPointTree3d *)*memoryPool;
    if (count_00 == count - 1U) {
      count_00 = (uint)count >> 1;
    }
    *memoryPool = (HaI8 *)(parent_00 + 1);
    *maxMemSize = *maxMemSize + -0x58;
    if (*maxMemSize < 0) {
      __assert_fail("maxMemSize >= 0",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/cecilysunday[P]chrono/src/chrono_thirdparty/HACDv2/dgConvexHull3d.cpp"
                    ,0x10d,
                    "dgAABBPointTree3d *dgConvexHull3d::BuildTree(dgAABBPointTree3d *const, dgHullVertex *const, hacd::HaI32, hacd::HaI32, hacd::HaI8 **, hacd::HaI32 &) const"
                   );
    }
    if (count_00 == 0) {
      __assert_fail("i0",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/cecilysunday[P]chrono/src/chrono_thirdparty/HACDv2/dgConvexHull3d.cpp"
                    ,0x10f,
                    "dgAABBPointTree3d *dgConvexHull3d::BuildTree(dgAABBPointTree3d *const, dgHullVertex *const, hacd::HaI32, hacd::HaI32, hacd::HaI8 **, hacd::HaI32 &) const"
                   );
    }
    if (count - count_00 == 0) {
      __assert_fail("count - i0",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/cecilysunday[P]chrono/src/chrono_thirdparty/HACDv2/dgConvexHull3d.cpp"
                    ,0x110,
                    "dgAABBPointTree3d *dgConvexHull3d::BuildTree(dgAABBPointTree3d *const, dgHullVertex *const, hacd::HaI32, hacd::HaI32, hacd::HaI8 **, hacd::HaI32 &) const"
                   );
    }
    pdVar12 = BuildTree(this,parent_00,points,count_00,baseIndex,memoryPool,maxMemSize);
    parent_00->m_left = pdVar12;
    pdVar12 = BuildTree(this,parent_00,points + (int)count_00,count - count_00,count_00 + baseIndex,
                        memoryPool,maxMemSize);
    parent_00->m_right = pdVar12;
    parent = local_80;
    auVar27 = local_98;
  }
  auVar4._8_8_ = 0xbf50624de0000000;
  auVar4._0_8_ = 0xbf50624de0000000;
  _local_78 = vaddpd_avx512vl(auVar27,auVar4);
  dStack_68 = local_108 + -0.0010000000474974513;
  parent_00->m_parent = parent;
  dStack_60 = 0.0;
  dgBigVector::dgBigVector((dgBigVector *)local_c8,(dgTemplateVector<double> *)local_78);
  dStack_68 = local_130 + 0.0010000000474974513;
  parent_00->m_box[0].super_dgTemplateVector<double>.m_x = (double)local_c8._0_8_;
  parent_00->m_box[0].super_dgTemplateVector<double>.m_y = (double)local_c8._8_8_;
  parent_00->m_box[0].super_dgTemplateVector<double>.m_z = dStack_b8;
  parent_00->m_box[0].super_dgTemplateVector<double>.m_w = dStack_b0;
  auVar5._8_8_ = 0x3f50624de0000000;
  auVar5._0_8_ = 0x3f50624de0000000;
  _local_78 = vaddpd_avx512vl(local_d8,auVar5);
  dStack_60 = 0.0;
  dgBigVector::dgBigVector((dgBigVector *)local_c8,(dgTemplateVector<double> *)local_78);
  parent_00->m_box[1].super_dgTemplateVector<double>.m_x = (double)local_c8._0_8_;
  parent_00->m_box[1].super_dgTemplateVector<double>.m_y = (double)local_c8._8_8_;
  parent_00->m_box[1].super_dgTemplateVector<double>.m_z = dStack_b8;
  parent_00->m_box[1].super_dgTemplateVector<double>.m_w = dStack_b0;
  return parent_00;
}

Assistant:

dgAABBPointTree3d* dgConvexHull3d::BuildTree (dgAABBPointTree3d* const parent, dgHullVertex* const points, hacd::HaI32 count, hacd::HaI32 baseIndex, hacd::HaI8** memoryPool, hacd::HaI32& maxMemSize) const
{
	dgAABBPointTree3d* tree = NULL;

	HACD_ASSERT (count);
	dgBigVector minP ( hacd::HaF32 (1.0e15f),  hacd::HaF32 (1.0e15f),  hacd::HaF32 (1.0e15f), hacd::HaF32 (0.0f)); 
	dgBigVector maxP (-hacd::HaF32 (1.0e15f), -hacd::HaF32 (1.0e15f), -hacd::HaF32 (1.0e15f), hacd::HaF32 (0.0f)); 
	if (count <= DG_VERTEX_CLUMP_SIZE_3D) {

		dgAABBPointTree3dClump* const clump = new (*memoryPool) dgAABBPointTree3dClump;
		*memoryPool += sizeof (dgAABBPointTree3dClump);
		maxMemSize -= sizeof (dgAABBPointTree3dClump);
		HACD_ASSERT (maxMemSize >= 0);


		clump->m_count = count;
		for (hacd::HaI32 i = 0; i < count; i ++) {
			clump->m_indices[i] = i + baseIndex;

			const dgBigVector& p = points[i];
			minP.m_x = GetMin (p.m_x, minP.m_x); 
			minP.m_y = GetMin (p.m_y, minP.m_y); 
			minP.m_z = GetMin (p.m_z, minP.m_z); 

			maxP.m_x = GetMax (p.m_x, maxP.m_x); 
			maxP.m_y = GetMax (p.m_y, maxP.m_y); 
			maxP.m_z = GetMax (p.m_z, maxP.m_z); 
		}

		clump->m_left = NULL;
		clump->m_right = NULL;
		tree = clump;

	} else {
		dgBigVector median (hacd::HaF32 (0.0f), hacd::HaF32 (0.0f), hacd::HaF32 (0.0f), hacd::HaF32 (0.0f));
		dgBigVector varian (hacd::HaF32 (0.0f), hacd::HaF32 (0.0f), hacd::HaF32 (0.0f), hacd::HaF32 (0.0f));
		for (hacd::HaI32 i = 0; i < count; i ++) {

			const dgBigVector& p = points[i];
			minP.m_x = GetMin (p.m_x, minP.m_x); 
			minP.m_y = GetMin (p.m_y, minP.m_y); 
			minP.m_z = GetMin (p.m_z, minP.m_z); 

			maxP.m_x = GetMax (p.m_x, maxP.m_x); 
			maxP.m_y = GetMax (p.m_y, maxP.m_y); 
			maxP.m_z = GetMax (p.m_z, maxP.m_z); 

			median += p;
			varian += p.CompProduct (p);
		}

		varian = varian.Scale (hacd::HaF32 (count)) - median.CompProduct(median);
		hacd::HaI32 index = 0;
		hacd::HaF64 maxVarian = hacd::HaF64 (-1.0e10f);
		for (hacd::HaI32 i = 0; i < 3; i ++) {
			if (varian[i] > maxVarian) {
				index = i;
				maxVarian = varian[i];
			}
		}
		dgBigVector center = median.Scale (hacd::HaF64 (1.0f) / hacd::HaF64 (count));

		hacd::HaF64 test = center[index];

		hacd::HaI32 i0 = 0;
		hacd::HaI32 i1 = count - 1;
		do {    
			for (; i0 <= i1; i0 ++) {
				hacd::HaF64 val = points[i0][index];
				if (val > test) {
					break;
				}
			}

			for (; i1 >= i0; i1 --) {
				hacd::HaF64 val = points[i1][index];
				if (val < test) {
					break;
				}
			}

			if (i0 < i1)	{
				Swap(points[i0], points[i1]);
				i0++; 
				i1--;
			}
		} while (i0 <= i1);

		if (i0 == 0){
			i0 = count / 2;
		}
		if (i0 == (count - 1)){
			i0 = count / 2;
		}

		tree = new (*memoryPool) dgAABBPointTree3d;
		*memoryPool += sizeof (dgAABBPointTree3d);
		maxMemSize -= sizeof (dgAABBPointTree3d);
		HACD_ASSERT (maxMemSize >= 0);

		HACD_ASSERT (i0);
		HACD_ASSERT (count - i0);

		tree->m_left = BuildTree (tree, points, i0, baseIndex, memoryPool, maxMemSize);
		tree->m_right = BuildTree (tree, &points[i0], count - i0, i0 + baseIndex, memoryPool, maxMemSize);
	}

	HACD_ASSERT (tree);
	tree->m_parent = parent;
	tree->m_box[0] = minP - dgBigVector (hacd::HaF64 (1.0e-3f), hacd::HaF64 (1.0e-3f), hacd::HaF64 (1.0e-3f), hacd::HaF64 (1.0f));
	tree->m_box[1] = maxP + dgBigVector (hacd::HaF64 (1.0e-3f), hacd::HaF64 (1.0e-3f), hacd::HaF64 (1.0e-3f), hacd::HaF64 (1.0f));
	return tree;
}